

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

bool operator==(Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *x,Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *y)

{
  int *in_RSI;
  int *in_RDI;
  undefined1 local_11;
  
  local_11 = false;
  if (*in_RDI == *in_RSI) {
    local_11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)y);
  }
  return local_11;
}

Assistant:

bool operator==(const Pair& x, const Pair& y)
  {
    return x.a == y.a && x._b == y._b;
  }